

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void unpack_weights_and_set_round_const
               (ConvolveParams *conv_params,int round_bits,int offset_bits,__m128i *res_sub_const,
               __m128i *round_bits_const,__m128i *wt)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  
  bVar1 = (char)offset_bits - (char)conv_params->round_1;
  auVar3 = ZEXT416((uint)((-1 << (bVar1 - 1 & 0x1f)) + (-1 << (bVar1 & 0x1f))));
  auVar3 = pshuflw(auVar3,auVar3,0);
  uVar2 = auVar3._0_4_;
  *(undefined4 *)*res_sub_const = uVar2;
  *(undefined4 *)((long)*res_sub_const + 4) = uVar2;
  *(undefined4 *)(*res_sub_const + 1) = uVar2;
  *(undefined4 *)((long)*res_sub_const + 0xc) = uVar2;
  auVar3 = ZEXT416((uint)(1 << ((byte)round_bits & 0x1f)) >> 1);
  auVar3 = pshuflw(auVar3,auVar3,0);
  uVar2 = auVar3._0_4_;
  *(undefined4 *)*round_bits_const = uVar2;
  *(undefined4 *)((long)*round_bits_const + 4) = uVar2;
  *(undefined4 *)(*round_bits_const + 1) = uVar2;
  *(undefined4 *)((long)*round_bits_const + 0xc) = uVar2;
  uVar2 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  *(undefined4 *)*wt = uVar2;
  *(undefined4 *)((long)*wt + 4) = uVar2;
  *(undefined4 *)(*wt + 1) = uVar2;
  *(undefined4 *)((long)*wt + 0xc) = uVar2;
  return;
}

Assistant:

static inline void unpack_weights_and_set_round_const(
    ConvolveParams *conv_params, const int round_bits, const int offset_bits,
    __m128i *res_sub_const, __m128i *round_bits_const, __m128i *wt) {
  *res_sub_const =
      _mm_set1_epi16(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  *round_bits_const = _mm_set1_epi16(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16((int16_t)w0);
  const __m128i wt1 = _mm_set1_epi16((int16_t)w1);
  *wt = _mm_unpacklo_epi16(wt0, wt1);
}